

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O0

BBox<3> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
          (BBox<3> *__return_storage_ptr__,int param_2,int first,GetBBoxOp<3> *param_4)

{
  double local_358;
  double local_350;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  undefined1 local_2f0 [48];
  double local_2c0;
  BBox<3> c;
  type transform_local;
  GetBBoxOp<3> *transform_local_1;
  int local_270;
  int local_26c;
  IntIterator last_local;
  IntIterator first_local;
  undefined1 local_248 [48];
  undefined1 local_218 [48];
  undefined1 local_1e8 [48];
  undefined1 local_1b8 [48];
  long local_188;
  double local_180;
  Vector<3> v;
  double local_158 [12];
  int local_f8;
  int local_f4;
  Int i;
  int local_e4;
  double *local_e0;
  int local_d4;
  double *local_d0;
  int local_c4;
  double *local_c0;
  int local_b4;
  double *local_b0;
  int local_a4;
  double *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int local_78;
  int local_74;
  Int j;
  int local_64;
  double *local_60;
  int local_54;
  double *local_50;
  int local_44;
  double *local_40;
  double *local_38;
  double *local_30;
  double local_28;
  double local_20;
  double local_18;
  double *local_10;
  
  entering_parallel = 1;
  local_270 = first;
  local_26c = param_2;
  GetBBoxOp<3>::GetBBoxOp((GetBBoxOp<3> *)(c.max.super_Few<double,_3>.array_ + 2),param_4);
  entering_parallel = 0;
  for (; _last_local = &local_270, local_26c != local_270; local_26c = local_26c + 1) {
    memcpy(local_2f0,&stack0x00000008,0x30);
    v.super_Few<double,_3>.array_[2]._4_4_ = local_26c;
    _j = c.max.super_Few<double,_3>.array_ + 2;
    for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
      local_54 = local_26c * 3 + local_78;
      local_64 = local_78;
      local_60 = &local_180;
      local_60[local_78] =
           (double)(&(transform_local.coords.write_.shared_alloc_.alloc)->size)[local_54];
      local_50 = _j;
      local_44 = local_54;
      local_40 = _j;
      local_38 = _j;
      local_30 = _j;
    }
    local_28 = local_180;
    local_20 = v.super_Few<double,_3>.array_[0];
    local_18 = v.super_Few<double,_3>.array_[1];
    local_10 = &local_320;
    local_320 = local_180;
    local_318 = v.super_Few<double,_3>.array_[0];
    local_310 = v.super_Few<double,_3>.array_[1];
    local_308 = local_180;
    local_300 = v.super_Few<double,_3>.array_[0];
    local_2f8 = v.super_Few<double,_3>.array_[1];
    local_74 = v.super_Few<double,_3>.array_[2]._4_4_;
    memcpy(local_218,&local_320,0x30);
    memcpy(local_248,local_2f0,0x30);
    local_188 = (long)&transform_local_1 + 7;
    memcpy(local_1b8,local_248,0x30);
    memcpy(local_1e8,local_218,0x30);
    memcpy(local_158 + 6,local_1e8,0x30);
    memcpy(local_158,local_1b8,0x30);
    for (local_f8 = 0; local_f8 < 3; local_f8 = local_f8 + 1) {
      local_a4 = local_f8;
      local_a0 = local_158;
      local_90 = local_a0[local_f8];
      local_b4 = local_f8;
      local_b0 = local_158 + 6;
      local_98 = local_b0[local_f8];
      local_350 = local_90;
      if (local_98 < local_90) {
        local_350 = local_98;
      }
      local_c4 = local_f8;
      local_c0 = &local_2c0;
      local_c0[local_f8] = local_350;
      local_d0 = local_158 + 3;
      local_d4 = local_f8;
      local_80 = local_d0[local_f8];
      local_e0 = local_158 + 9;
      local_e4 = local_f8;
      local_88 = local_e0[local_f8];
      local_358 = local_80;
      if (local_80 < local_88) {
        local_358 = local_88;
      }
      _i = c.min.super_Few<double,_3>.array_ + 2;
      local_f4 = local_f8;
      _i[local_f8] = local_358;
    }
    memcpy(&stack0x00000008,&local_2c0,0x30);
  }
  memcpy(__return_storage_ptr__,&stack0x00000008,0x30);
  GetBBoxOp<3>::~GetBBoxOp((GetBBoxOp<3> *)(c.max.super_Few<double,_3>.array_ + 2));
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}